

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfogatherer.cpp
# Opt level: O2

void __thiscall
QFileInfoGatherer::fetch
          (QFileInfoGatherer *this,QFileInfo *fileInfo,QElapsedTimer *base,bool *firstTime,
          QList<std::pair<QString,_QFileInfo>_> *updatedFiles,QString *path)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  pair<QString,_QFileInfo> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QFileInfo::fileName();
  std::pair<QString,_QFileInfo>::pair<QString,_true>(&local_58,(QString *)&local_70,fileInfo);
  QList<std::pair<QString,QFileInfo>>::emplaceBack<std::pair<QString,QFileInfo>>
            ((QList<std::pair<QString,QFileInfo>> *)updatedFiles,&local_58);
  std::pair<QString,_QFileInfo>::~pair(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  local_58.first.d.d = (Data *)0x8000000000000000;
  local_58.first.d.ptr = (char16_t *)0x8000000000000000;
  QElapsedTimer::start();
  if ((*firstTime != true) || ((ulong)(updatedFiles->d).size < 0x65)) {
    lVar1 = QElapsedTimer::msecsTo(base);
    if (lVar1 < 0x3e9) goto LAB_00569b1c;
  }
  updates(this,path,updatedFiles);
  QList<std::pair<QString,_QFileInfo>_>::clear(updatedFiles);
  *(undefined4 *)&base->t1 = local_58.first.d.d._0_4_;
  *(undefined4 *)((long)&base->t1 + 4) = local_58.first.d.d._4_4_;
  *(undefined4 *)&base->t2 = local_58.first.d.ptr._0_4_;
  *(undefined4 *)((long)&base->t2 + 4) = local_58.first.d.ptr._4_4_;
  *firstTime = false;
LAB_00569b1c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileInfoGatherer::fetch(const QFileInfo &fileInfo, QElapsedTimer &base, bool &firstTime,
                              QList<std::pair<QString, QFileInfo>> &updatedFiles, const QString &path)
{
    updatedFiles.emplace_back(std::pair(fileInfo.fileName(), fileInfo));
    QElapsedTimer current;
    current.start();
    if ((firstTime && updatedFiles.size() > 100) || base.msecsTo(current) > 1000) {
        emit updates(path, updatedFiles);
        updatedFiles.clear();
        base = current;
        firstTime = false;
    }
}